

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Tree::change_type(Tree *this,size_t node,NodeType type)

{
  code *pcVar1;
  size_t b;
  bool bVar2;
  error_flags eVar3;
  NodeType_e NVar4;
  NodeType_e in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  NodeData *d;
  char msg_2 [86];
  char msg_1 [67];
  char msg [64];
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  Tree *in_stack_fffffffffffffd38;
  Location *in_stack_fffffffffffffd40;
  Location *this_00;
  undefined1 *in_stack_fffffffffffffd68;
  Tree *in_stack_fffffffffffffd70;
  undefined1 local_280 [8];
  NodeData *local_278;
  Location local_248 [2];
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  Tree *in_stack_fffffffffffffe30;
  undefined1 local_1c8 [80];
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  Tree *local_160;
  undefined1 local_158 [72];
  undefined8 local_110;
  NodeType_e local_100 [2];
  undefined8 local_f0;
  undefined8 local_e0;
  undefined8 local_d0;
  NodeData *local_c0;
  NodeType_e *local_b8;
  NodeType_e *local_b0;
  NodeType_e *local_a8;
  NodeType_e *local_a0;
  NodeType_e *local_98;
  NodeType_e *local_90;
  NodeType_e *local_88;
  NodeType_e *local_80;
  NodeType_e *local_78;
  NodeData *local_70;
  NodeData *local_68;
  NodeType_e *local_60;
  NodeType_e *local_58;
  undefined8 local_50;
  NodeData *local_40;
  undefined8 local_38;
  NodeData *local_28;
  NodeType_e *local_20;
  NodeData *local_18;
  NodeType_e local_10;
  undefined1 *local_8;
  
  local_a8 = local_100;
  local_110 = in_RSI;
  local_100[0] = in_RDX;
  if ((((in_RDX & KEYVAL) != VAL) && (local_90 = local_100, (in_RDX & MAP) == NOTYPE)) &&
     (local_78 = local_100, (in_RDX & SEQ) == NOTYPE)) {
    memcpy(local_158,"check failed: (type.is_val() || type.is_map() || type.is_seq())",0x40);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffd70 = *(Tree **)(in_RDI + 0x58);
    in_stack_fffffffffffffd68 = local_158;
    Location::Location(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
    (*(code *)in_stack_fffffffffffffd70)
              (in_stack_fffffffffffffd68,0x40,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffd20 = uStack_178;
    in_stack_fffffffffffffd24 = uStack_174;
    in_stack_fffffffffffffd28 = local_170;
    in_stack_fffffffffffffd2c = uStack_16c;
    in_stack_fffffffffffffd30 = uStack_168;
    in_stack_fffffffffffffd34 = uStack_164;
    in_stack_fffffffffffffd38 = local_160;
  }
  local_b0 = local_100;
  local_98 = local_100;
  local_80 = local_100;
  if ((char)(((local_100[0] & KEYVAL) == VAL) + ((local_100[0] & MAP) != NOTYPE) +
            ((local_100[0] & SEQ) != NOTYPE)) != '\x01') {
    memcpy(local_1c8,"check failed: (type.is_val() + type.is_map() + type.is_seq() == 1)",0x43);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    b = CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30);
    in_stack_fffffffffffffd30 = in_stack_fffffffffffffe28;
    in_stack_fffffffffffffd34 = in_stack_fffffffffffffe2c;
    Location::Location(in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,b,
                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
    in_stack_fffffffffffffd38 = in_stack_fffffffffffffe30;
    in_stack_fffffffffffffe28 = in_stack_fffffffffffffd30;
    in_stack_fffffffffffffe2c = in_stack_fffffffffffffd34;
    in_stack_fffffffffffffe30 = in_stack_fffffffffffffd38;
    (*pcVar1)(local_1c8,0x43,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffd20 = uStack_1e8;
    in_stack_fffffffffffffd24 = uStack_1e4;
    in_stack_fffffffffffffd28 = local_1e0;
    in_stack_fffffffffffffd2c = uStack_1dc;
  }
  local_58 = local_100;
  NVar4 = local_100[0] & KEY;
  local_d0 = local_110;
  local_70 = _p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
  if ((NVar4 != NOTYPE) != (((local_70->m_type).type & KEY) != NOTYPE)) {
    local_e0 = local_110;
    local_68 = _p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    if ((((local_68->m_type).type & KEY) == NOTYPE) ||
       (local_60 = local_100, (local_100[0] & KEY) != NOTYPE)) {
      memcpy(local_248,
             "check failed: (type.has_key() == has_key(node) || (has_key(node) && !type.has_key()))"
             ,0x56);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(in_RDI + 0x58);
      this_00 = local_248;
      Location::Location(this_00,(char *)in_stack_fffffffffffffd38,
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                         CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
      (*pcVar1)(this_00,0x56,*(undefined8 *)(in_RDI + 0x40));
    }
  }
  local_278 = _p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
  local_a0 = local_100;
  if ((local_100[0] & MAP) != NOTYPE) {
    local_50 = local_110;
    local_40 = _p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    if (((local_40->m_type).type & MAP) != NOTYPE) {
      return false;
    }
  }
  local_88 = local_100;
  if ((local_100[0] & SEQ) != NOTYPE) {
    local_38 = local_110;
    local_28 = _p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    if (((local_28->m_type).type & SEQ) != NOTYPE) {
      return false;
    }
  }
  local_b8 = local_100;
  if ((local_100[0] & KEYVAL) == VAL) {
    local_f0 = local_110;
    local_c0 = _p(in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
    if (((local_c0->m_type).type & KEYVAL) == VAL) {
      return false;
    }
  }
  local_18 = local_278;
  local_20 = local_100;
  local_10 = (local_278->m_type).type & ~(SEQ|MAP|VAL) | local_100[0];
  local_8 = local_280;
  (local_278->m_type).type = local_10;
  remove_children(in_stack_fffffffffffffe30,
                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  return true;
}

Assistant:

bool Tree::change_type(size_t node, NodeType type)
{
    _RYML_CB_ASSERT(m_callbacks, type.is_val() || type.is_map() || type.is_seq());
    _RYML_CB_ASSERT(m_callbacks, type.is_val() + type.is_map() + type.is_seq() == 1);
    _RYML_CB_ASSERT(m_callbacks, type.has_key() == has_key(node) || (has_key(node) && !type.has_key()));
    NodeData *d = _p(node);
    if(type.is_map() && is_map(node))
        return false;
    else if(type.is_seq() && is_seq(node))
        return false;
    else if(type.is_val() && is_val(node))
        return false;
    d->m_type = (d->m_type & (~(MAP|SEQ|VAL))) | type;
    remove_children(node);
    return true;
}